

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

MIR_reg_t get_stack_loc(gen_ctx_t gen_ctx,MIR_reg_t start_loc,MIR_type_t type,bitmap_t conflict_locs
                       ,int *slots_num_ref)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  byte bVar3;
  long *plVar4;
  bitmap_el_t bVar5;
  MIR_reg_t *pMVar6;
  ulong *puVar7;
  void *pvVar8;
  VARR_MIR_reg_t *pVVar9;
  VARR_spill_cache_el_t *pVVar10;
  spill_cache_el_t *psVar11;
  bitmap_t *ppVVar12;
  VARR_live_range_t *pVVar13;
  undefined8 uVar14;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar15 [32];
  anon_union_32_12_57d33f68_for_u aVar16;
  anon_union_32_12_57d33f68_for_u aVar17;
  undefined1 auVar18 [32];
  anon_union_32_12_57d33f68_for_u aVar19;
  MIR_op_mode_t MVar20;
  MIR_type_t MVar21;
  MIR_reg_t MVar22;
  int iVar23;
  gen_ctx *pgVar24;
  gen_ctx_t pgVar25;
  gen_ctx *extraout_RAX;
  MIR_context_t pMVar26;
  bitmap_el_t *pbVar27;
  ra_ctx *prVar28;
  ulong uVar29;
  MIR_insn_t_conflict pMVar30;
  int64_t iVar31;
  MIR_insn_t_conflict insn;
  gen_ctx *pgVar32;
  undefined1 (*pauVar33) [32];
  live_range_t_conflict plVar34;
  MIR_error_func_t p_Var35;
  char cVar36;
  int iVar37;
  int iVar38;
  bitmap_el_t *pbVar39;
  ulong uVar40;
  MIR_insn_t pMVar41;
  long lVar42;
  MIR_disp_t MVar43;
  MIR_reg_t base_reg;
  MIR_reg_t base_reg_00;
  int extraout_EDX;
  long extraout_RDX;
  undefined8 *puVar44;
  MIR_insn_t extraout_RDX_00;
  anon_union_32_12_57d33f68_for_u *paVar45;
  char *pcVar46;
  MIR_context_t bm;
  bool bVar47;
  gen_ctx *pgVar48;
  gen_ctx_t pgVar49;
  FILE *pFVar50;
  MIR_error_func_t p_Var51;
  uint uVar52;
  ulong unaff_RBP;
  ulong uVar53;
  undefined4 in_register_00000034;
  bitmap_t pVVar54;
  gen_ctx *pgVar55;
  ulong uVar56;
  VARR_bitmap_t *pVVar57;
  code *nb;
  gen_ctx_t pgVar58;
  ulong uVar59;
  MIR_context_t pMVar60;
  gen_ctx_t pgVar61;
  long lVar62;
  int iVar63;
  size_t sVar64;
  undefined8 *puVar65;
  int slots_num;
  uint uVar66;
  uint uVar67;
  long lVar68;
  gen_ctx_t unaff_R12;
  gen_ctx_t pgVar69;
  uint *puVar70;
  MIR_op_t *pMVar71;
  MIR_context_t unaff_R13;
  uint *puVar72;
  uint *puVar73;
  ulong unaff_R14;
  bitmap_t pVVar74;
  gen_ctx_t unaff_R15;
  gen_ctx_t pgVar75;
  lr_gap_t el;
  MIR_reg_t MStack_478;
  MIR_op_t MStack_430;
  ulong *puStack_3f8;
  ulong uStack_3f0;
  bitmap_el_t *pbStack_3e8;
  ulong uStack_3e0;
  gen_ctx_t pgStack_3d8;
  code *pcStack_3d0;
  uint uStack_30c;
  uint uStack_308;
  int iStack_304;
  anon_union_32_12_57d33f68_for_u *paStack_300;
  MIR_op_t *pMStack_2f8;
  MIR_insn_t_conflict pMStack_2f0;
  size_t sStack_2e8;
  MIR_insn_t pMStack_2e0;
  MIR_op_t MStack_2d8;
  MIR_op_t MStack_2a8;
  MIR_op_t MStack_278;
  void *apvStack_248 [2];
  int64_t iStack_238;
  char *pcStack_230;
  undefined8 uStack_228;
  MIR_disp_t MStack_220;
  bitmap_t pVStack_218;
  bitmap_t pVStack_210;
  bitmap_t pVStack_208;
  bitmap_t pVStack_200;
  bitmap_t pVStack_1f8;
  bitmap_t pVStack_1f0;
  int aiStack_1e8 [12];
  undefined1 auStack_1b8 [16];
  undefined1 auStack_1a8 [16];
  undefined1 auStack_198 [16];
  gen_ctx_t pgStack_150;
  gen_ctx_t pgStack_148;
  MIR_context_t pMStack_140;
  bitmap_t pVStack_138;
  gen_ctx_t pgStack_130;
  code *pcStack_128;
  gen_ctx_t pgStack_118;
  gen_ctx *pgStack_110;
  gen_ctx *pgStack_108;
  MIR_insn_t pMStack_100;
  MIR_context_t pMStack_f8;
  uint uStack_ec;
  gen_ctx_t pgStack_e8;
  gen_ctx_t pgStack_e0;
  ulong uStack_d8;
  bitmap_el_t *pbStack_d0;
  gen_ctx_t pgStack_c8;
  gen_ctx_t pgStack_c0;
  MIR_context_t pMStack_b8;
  ulong uStack_b0;
  gen_ctx_t pgStack_a8;
  code *pcStack_a0;
  gen_ctx *pgStack_98;
  gen_ctx_t pgStack_90;
  gen_ctx_t pgStack_88;
  MIR_context_t pMStack_80;
  ulong uStack_78;
  gen_ctx_t pgStack_70;
  code *pcStack_68;
  gen_ctx *pgStack_60;
  gen_ctx_t pgStack_58;
  ulong uStack_50;
  gen_ctx_t pgStack_48;
  code *pcStack_40;
  
  pgVar55 = (gen_ctx *)CONCAT44(in_register_00000034,start_loc);
  sVar64 = gen_ctx->func_stack_slots_num;
  pgVar24 = (gen_ctx *)(ulong)start_loc;
  pgVar32 = (gen_ctx *)(sVar64 + 0x21);
  if (pgVar24 <= pgVar32) {
    pgVar24 = (gen_ctx *)0xffffffff;
    do {
      uVar67 = (uint)pgVar55;
      bVar47 = 0x21 < uVar67 && type == MIR_T_LD;
      uVar52 = (uint)bVar47;
      uVar66 = uVar52 + 1;
      pgVar48 = (gen_ctx *)(ulong)(uVar67 + bVar47);
      if (pgVar32 < pgVar48) break;
      if (conflict_locs == (bitmap_t)0x0) {
        pcStack_40 = available_hreg_p;
        get_stack_loc_cold_1();
        iVar37 = (int)conflict_locs->size;
        iVar63 = *(int *)((long)&conflict_locs->size + 4);
        pbVar39 = (bitmap_el_t *)(long)iVar63;
        if (iVar63 < iVar37) {
          return 1;
        }
        pgVar25 = (gen_ctx_t)(long)(int)gen_ctx;
        uVar53 = 0;
        uVar67 = (int)gen_ctx + 1;
        puVar65 = (undefined8 *)(1L << ((ulong)pgVar25 & 0x3f));
        pgVar58 = (gen_ctx_t)((ulong)pgVar25 >> 6);
        uVar52 = (iVar63 - iVar37) + 1;
        pgVar61 = (gen_ctx_t)(long)iVar37;
        pgVar69 = unaff_R12;
        pgVar75 = unaff_R15;
        goto LAB_0016dfbb;
      }
      unaff_R14 = (ulong)uVar66;
      unaff_R15 = (gen_ctx_t)((ulong)pgVar55 & 0xffffffff);
      do {
        if (unaff_R15 < (gen_ctx_t)(conflict_locs->els_num << 6)) {
          unaff_R13 = (MIR_context_t)((ulong)unaff_R15 >> 6);
          unaff_R12 = (gen_ctx_t)conflict_locs->varr[(long)unaff_R13];
          if (((ulong)unaff_R12 >> ((ulong)unaff_R15 & 0x3f) & 1) != 0) goto LAB_0016df10;
        }
        unaff_R15 = (gen_ctx_t)(ulong)((int)unaff_R15 + 1);
        unaff_R14 = unaff_R14 - 1;
      } while (unaff_R14 != 0);
      uVar52 = uVar52 & uVar67 - 0x22;
      unaff_RBP = (ulong)uVar52;
      uVar52 = ~(uint)pgVar24 | uVar52;
      unaff_R14 = (ulong)uVar52;
      if (uVar52 == 0) {
        pgVar24 = (gen_ctx *)((ulong)pgVar55 & 0xffffffff);
      }
LAB_0016df10:
      pgVar55 = (gen_ctx *)(ulong)(uVar67 + 1);
    } while (pgVar55 <= pgVar32);
    MVar22 = (MIR_reg_t)pgVar24;
    if (MVar22 != 0xffffffff) goto LAB_0016df63;
  }
  uVar66 = 1;
  uVar52 = 0;
  do {
    bVar47 = uVar52 == 0;
    uVar52 = 2;
    if (bVar47) {
      uVar52 = (uint)sVar64;
      pgVar24 = (gen_ctx *)(ulong)(uVar52 + 0x22);
      bVar47 = uVar52 < 0xffffffde && type == MIR_T_LD;
      uVar66 = bVar47 + 1;
      uVar52 = (uint)((bVar47 & uVar52) == 0);
    }
    MVar22 = (MIR_reg_t)pgVar24;
    sVar64 = sVar64 + 1;
  } while (uVar52 < uVar66);
  gen_ctx->func_stack_slots_num = sVar64;
LAB_0016df63:
  *slots_num_ref = uVar66;
  return MVar22;
LAB_00170360:
  if ((iVar63 != -1) && (*(int *)((long)pvVar8 + lVar68 + lVar42 + 4) == iVar63)) {
    return *(MIR_reg_t *)((long)pvVar8 + lVar68 + 8 + lVar42);
  }
  iVar23 = *(int *)((long)pvVar8 + lVar68 + lVar42 + 8);
  if (uVar67 == 0) {
    iVar38 = 10;
    if (uVar52 < 3) {
      iVar38 = *(int *)(&DAT_001b1a90 + (ulong)uVar52 * 4);
    }
    uVar66 = 1;
    if (iVar23 != iVar38) goto LAB_00170398;
  }
  else {
LAB_00170398:
    iVar38 = 0xb;
    if (uVar52 < 3) {
      iVar38 = *(int *)(&DAT_001b1a9c + (ulong)uVar52 * 4);
    }
    uVar66 = uVar67;
    if (iVar23 == iVar38) {
      uVar66 = 2;
    }
  }
  uVar67 = uVar66;
  lVar68 = lVar68 + 0xc;
  if (lVar62 * 0xc == lVar68) {
    if (1 < uVar67) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
LAB_001703e4:
    if (extraout_EDX == 10) {
      MVar22 = 0xffffffff;
    }
    else {
      if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
        iVar23 = 0x19;
      }
      else {
        iVar23 = 0xb;
      }
      MVar22 = iVar23 - (uint)(uVar67 == 0);
    }
    *(int *)((long)pvVar8 + uVar53 * 4 + 0x180) = iVar37 + 1;
    if (iVar37 < 8) {
      *(int *)((long)pvVar8 + lVar62 * 0xc + lVar42 + 4) = iVar63;
      *(int *)((long)pvVar8 + lVar62 * 0xc + lVar42) = extraout_EDX;
      *(MIR_reg_t *)((long)pvVar8 + lVar62 * 0xc + lVar42 + 8) = MVar22;
      return MVar22;
    }
    __assert_fail("rld_num < (2 * 4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
  }
  goto LAB_00170360;
LAB_0017022a:
  spill_restore_reg_cold_7();
LAB_0017022f:
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
  while( true ) {
    uVar53 = (ulong)((long)pbVar39 <= (long)pgVar61);
    uVar52 = uVar52 - 1;
    pgVar61 = (gen_ctx_t)((long)&pgVar61->ctx + 1);
    if (uVar52 == 0) break;
LAB_0016dfbb:
    pgVar49 = (gen_ctx_t)(ulong)uVar52;
    plVar4 = *(long **)(extraout_RDX + (long)pgVar61 * 8);
    if (plVar4 == (long *)0x0) {
      pcStack_68 = gap_lr_spill_cost;
      pgStack_60 = pgVar48;
      pgStack_58 = unaff_R12;
      uStack_50 = unaff_R14;
      pgStack_48 = unaff_R15;
      pcStack_40 = (code *)unaff_RBP;
      available_hreg_p_cold_1();
      pVVar54 = pgVar58->temp_bitmap;
      uStack_78 = 0;
      pgVar25 = pgVar58;
      pMVar60 = unaff_R13;
      uVar29 = uStack_78;
      pgStack_98 = extraout_RAX;
      pgStack_90 = pgVar49;
      pgStack_88 = pgVar69;
      pMStack_80 = unaff_R13;
      pgStack_70 = pgVar75;
      pcStack_68 = (code *)uVar53;
      if ((pVVar54 == (bitmap_t)0x0) || (pVVar54->varr == (bitmap_el_t *)0x0)) goto LAB_0016e225;
      pVVar54->els_num = 0;
      uVar29 = 0;
      pMVar60 = pgVar55->ctx;
      if (pMVar60 == (MIR_context_t)0x0) goto LAB_0016e1e5;
      uVar53 = 1;
      pgStack_98 = pgVar55;
      goto LAB_0016e05c;
    }
    pgVar75 = (gen_ctx_t)(*plVar4 << 6);
    if (((pgVar25 < pgVar75) &&
        (pgVar69 = (gen_ctx_t)plVar4[2],
        ((ulong)pgVar69->call_used_hard_regs[(long)((long)&pgVar58[-1].spot2attr + 3)] &
        (ulong)puVar65) != 0)) ||
       ((1 < (int)pgVar55 &&
        ((0x21 < uVar67 ||
         (((gen_ctx_t)(ulong)uVar67 < pgVar75 &&
          ((*(ulong *)plVar4[2] & 1L << ((ulong)uVar67 & 0x3f)) != 0)))))))) break;
  }
  return (MIR_reg_t)uVar53;
  while( true ) {
    pbVar39 = (bitmap_el_t *)((ulong)pgVar75 >> 6);
    puVar7 = (ulong *)((long)((MIR_insn_t)pgVar69->curr_func_item)->ops + (long)pbVar39 * 8 + -0x20)
    ;
    *puVar7 = *puVar7 | 1L << ((ulong)pgVar75 & 0x3f);
    pMVar60 = (MIR_context_t)pMVar60->c2mir_ctx;
    if (pMVar60 == (MIR_context_t)0x0) break;
LAB_0016e05c:
    pgVar69 = (gen_ctx_t)pgVar58->temp_bitmap;
    pgVar75 = (gen_ctx_t)pMVar60->gen_ctx->ctx;
    pgVar55 = (gen_ctx *)((long)&pgVar75->ctx + 1);
    pcStack_a0 = (code *)0x16e073;
    pgVar25 = pgVar69;
    bitmap_expand((bitmap_t)pgVar69,(size_t)pgVar55);
    if (pgVar69 == (gen_ctx_t)0x0) {
      pcStack_a0 = (code *)0x16e21b;
      gap_lr_spill_cost_cold_3();
      goto LAB_0016e21b;
    }
  }
  pMVar26 = pgStack_98->ctx;
  if (pMVar26 != (MIR_context_t)0x0) {
    uVar29 = 0;
    do {
      pgVar32 = pMVar26->gen_ctx;
      pVVar54 = pgVar32->call_used_hard_regs[6];
      iVar37 = -2;
      do {
        iVar63 = iVar37;
        pVVar54 = (bitmap_t)pVVar54[1].els_num;
        iVar37 = iVar63 + 1;
      } while (pVVar54 != (bitmap_t)0x0);
      if (iVar37 < 0) {
LAB_0016e1f7:
        pcStack_a0 = (code *)0x16e216;
        __assert_fail("level >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1748,"int bb_loop_level(bb_t)");
      }
      pgVar55 = (gen_ctx *)pgVar32->addr_regs;
      uVar52 = iVar63 + 2;
      pbVar39 = (bitmap_el_t *)(ulong)uVar52;
      if (pgVar55 != (gen_ctx *)0x0) {
        pgVar61 = (gen_ctx_t)pgVar58->temp_bitmap;
        if (pgVar61 == (gen_ctx_t)0x0) goto LAB_0016e21b;
        pgVar25 = (gen_ctx_t)0xffffffff;
        puVar65 = (undefined8 *)((long)pgVar61->ctx << 6);
        do {
          pMVar41 = ((DLIST_LINK_MIR_insn_t *)&pgVar55->optimize_level)->prev;
          puVar44 = (undefined8 *)pMVar41->data;
          if (puVar44 < puVar65) {
            pgVar69 = (gen_ctx_t)((ulong)puVar44 >> 6);
            pgVar75 = *(gen_ctx_t *)
                       ((long)((MIR_insn_t)pgVar61->curr_func_item)->ops + (long)pgVar69 * 8 + -0x20
                       );
            if (((ulong)pgVar75 >> ((ulong)puVar44 & 0x3f) & 1) == 0) goto LAB_0016e114;
          }
          else {
LAB_0016e114:
            MVar43 = pMVar41[1].ops[0].u.mem.disp;
            iVar37 = -2;
            do {
              iVar63 = iVar37;
              MVar43 = *(long *)(MVar43 + 0x18);
              iVar37 = iVar63 + 1;
            } while (MVar43 != 0);
            if (iVar37 < 0) goto LAB_0016e1f7;
            if ((int)pgVar25 <= iVar37) {
              pgVar25 = (gen_ctx_t)(ulong)(iVar63 + 2);
            }
          }
          pgVar55 = (gen_ctx *)pgVar55->to_free;
        } while (pgVar55 != (gen_ctx *)0x0);
        if (-1 < (int)pgVar25) {
          if ((int)uVar52 <= (int)pgVar25) {
            pgVar25 = (gen_ctx_t)(ulong)uVar52;
          }
          uVar29 = (ulong)(uint)((int)uVar29 + (int)pgVar25 * 2);
        }
      }
      puVar44 = *(undefined8 **)&pgVar32->addr_insn_p;
      if (puVar44 != (undefined8 *)0x0) {
        pgVar55 = (gen_ctx *)pgVar58->temp_bitmap;
        if (pgVar55 == (gen_ctx *)0x0) goto LAB_0016e220;
        pgVar25 = (gen_ctx_t)0xffffffff;
        pgVar61 = (gen_ctx_t)((long)pgVar55->ctx << 6);
        do {
          puVar65 = (undefined8 *)*puVar44;
          pgVar49 = (gen_ctx_t)*puVar65;
          if ((pgVar61 <= pgVar49) ||
             (pgVar75 = (gen_ctx_t)((ulong)pgVar49 >> 6),
             (*(ulong *)((long)((MIR_insn_t)pgVar55->curr_func_item)->ops +
                        (long)pgVar75 * 8 + -0x20) >> ((ulong)pgVar49 & 0x3f) & 1) == 0)) {
            lVar42 = puVar65[0x13];
            puVar65 = (undefined8 *)0xfffffffe;
            do {
              lVar42 = *(long *)(lVar42 + 0x18);
              iVar37 = (int)puVar65;
              uVar67 = iVar37 + 1;
              puVar65 = (undefined8 *)(ulong)uVar67;
            } while (lVar42 != 0);
            if ((int)uVar67 < 0) goto LAB_0016e1f7;
            if ((int)pgVar25 <= (int)uVar67) {
              pgVar25 = (gen_ctx_t)(ulong)(iVar37 + 2);
            }
          }
          puVar44 = (undefined8 *)puVar44[3];
        } while (puVar44 != (undefined8 *)0x0);
        uVar67 = (uint)pgVar25;
        if (-1 < (int)uVar67) {
          if ((int)uVar67 < (int)uVar52) {
            uVar52 = uVar67;
          }
          uVar29 = (ulong)((int)uVar29 + uVar52 * 2);
        }
      }
      pMVar26 = (MIR_context_t)pMVar26->c2mir_ctx;
    } while (pMVar26 != (MIR_context_t)0x0);
  }
LAB_0016e1e5:
  return (MIR_reg_t)uVar29;
LAB_0016e21b:
  pcStack_a0 = (code *)0x16e220;
  gap_lr_spill_cost_cold_1();
LAB_0016e220:
  pcStack_a0 = (code *)0x16e225;
  gap_lr_spill_cost_cold_2();
  pgVar49 = pgVar58;
LAB_0016e225:
  pcStack_a0 = HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  pVVar54 = pgVar25->tied_regs;
  pgStack_108 = pgVar55;
  pgStack_c8 = pgVar49;
  pgStack_c0 = pgVar69;
  pMStack_b8 = pMVar60;
  uStack_b0 = uVar29;
  pgStack_a8 = pgVar75;
  pcStack_a0 = (code *)uVar53;
  if (pVVar54 == (bitmap_t)0x0) {
    pcStack_128 = (code *)0x16e5b0;
    HTAB_lr_gap_t_do_cold_8();
    pgVar58 = pgVar25;
    pgVar25 = pgVar61;
    pgVar61 = pgVar75;
LAB_0016e5b0:
    pcStack_128 = (code *)0x16e5b5;
    HTAB_lr_gap_t_do_cold_7();
LAB_0016e5b5:
    pcStack_128 = (code *)0x16e5ba;
    HTAB_lr_gap_t_do_cold_4();
    pVVar74 = pVVar54;
LAB_0016e5ba:
    pcStack_128 = (code *)0x16e5bf;
    HTAB_lr_gap_t_do_cold_3();
    pgVar75 = pgVar49;
LAB_0016e5bf:
    pcStack_128 = (code *)0x16e5c4;
    HTAB_lr_gap_t_do_cold_5();
LAB_0016e5c4:
    pcStack_128 = (code *)0x16e5c9;
    HTAB_lr_gap_t_do_cold_6();
    pVVar54 = pVVar74;
LAB_0016e5c9:
    pcStack_128 = (code *)0x16e5ce;
    HTAB_lr_gap_t_do_cold_1();
  }
  else {
    puVar44 = (undefined8 *)(((anon_union_32_12_57d33f68_for_u *)&pgVar25->addr_insn_p)->str).len;
    pgVar58 = pgVar25;
    if (puVar44 == (undefined8 *)0x0) goto LAB_0016e5b0;
    pgStack_110 = (gen_ctx *)pgVar25->curr_func_item;
    pgVar49 = (gen_ctx_t)pVVar54->els_num;
    pgVar69 = (gen_ctx_t)((ulong)pbVar39 & 0xffffffff);
    uVar52 = (int)pbVar39 - 1;
    uVar53 = (ulong)uVar52;
    pgStack_118 = pgVar25;
    pMStack_100 = extraout_RDX_00;
    if (1 < uVar52) {
LAB_0016e3d9:
      pcStack_128 = (code *)0x16e3f0;
      pgVar58 = pgStack_108;
      iVar37 = (*(code *)pgStack_118->debug_file)(pgStack_108,pMStack_100,pgStack_110);
      uVar67 = iVar37 + (uint)(iVar37 == 0);
      pgVar55 = (gen_ctx *)(ulong)uVar67;
      pgVar25 = pgStack_118;
      if (pgStack_118->tied_regs == (bitmap_t)0x0) goto LAB_0016e5b5;
      pbVar39 = (bitmap_el_t *)
                (((anon_union_32_12_57d33f68_for_u *)&pgStack_118->addr_insn_p)->str).len;
      pVVar74 = pVVar54;
      uStack_ec = uVar52;
      pgStack_e8 = pgVar61;
      pgStack_e0 = pgVar69;
      if (pbVar39 != (bitmap_el_t *)0x0) {
        pbVar27 = pgStack_118->tied_regs->varr;
        bVar5 = pbVar39[2];
        uVar53 = (ulong)((int)pgVar49 - 1);
        pMStack_f8 = (MIR_context_t)CONCAT44(pMStack_f8._4_4_,uVar67);
        pgVar32 = pgVar55;
        pgVar69 = pgStack_118;
        puVar72 = (uint *)0x0;
        uStack_d8 = uVar53;
        pbStack_d0 = pbVar27;
        do {
          uVar67 = uVar67 & (uint)uVar53;
          puVar70 = (uint *)((long)pbVar27 + (ulong)uVar67 * 4);
          uVar29 = (ulong)*puVar70;
          puVar73 = puVar70;
          if (uVar29 != 0xfffffffe) {
            if (*puVar70 == 0xffffffff) {
              if (1 < uStack_ec) {
                return 0;
              }
              *(int *)&pgVar69->ctx = *(int *)&pgVar69->ctx + 1;
              uVar53 = (ulong)*(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar69->optimize_level)->prev;
              if (puVar72 != (uint *)0x0) {
                puVar70 = puVar72;
              }
              *(int *)(bVar5 + uVar53 * 0x18) = (int)pgVar32;
              *(gen_ctx **)(bVar5 + 8 + uVar53 * 0x18) = pgStack_108;
              *(MIR_insn_t *)(bVar5 + 0x10 + uVar53 * 0x18) = pMStack_100;
              uVar52 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar69->optimize_level)->prev;
              *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar69->optimize_level)->prev = uVar52 + 1;
              *puVar70 = uVar52;
              pgStack_e8->ctx = (MIR_context_t)pgStack_108;
              ((DLIST_LINK_MIR_insn_t *)&pgStack_e8->optimize_level)->prev = pMStack_100;
              return 0;
            }
            puVar73 = puVar72;
            if (*(int *)(bVar5 + uVar29 * 0x18) == (int)pgVar32) {
              puVar1 = (undefined4 *)(bVar5 + uVar29 * 0x18);
              pcStack_128 = (code *)0x16e48e;
              iVar37 = (*(code *)((MIR_op_t *)&pgStack_118->debug_level)->data)
                                 (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),
                                  pgStack_108,pMStack_100,pgStack_110);
              pgVar61 = pgStack_e8;
              pgVar32 = (gen_ctx *)((ulong)pMStack_f8 & 0xffffffff);
              uVar53 = uStack_d8;
              pbVar27 = pbStack_d0;
              pgVar69 = pgStack_118;
              if (iVar37 != 0) {
                if ((int)pgStack_e0 == 3) {
                  *(int *)&pgStack_118->ctx = *(int *)&pgStack_118->ctx + -1;
                  *puVar70 = 0xfffffffe;
                  if (pgStack_118->to_free != (VARR_void_ptr_t *)0x0) {
                    pcStack_128 = (code *)0x16e590;
                    (*(code *)pgStack_118->to_free)
                              (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),pgStack_110);
                  }
                  *puVar1 = 0;
                }
                else {
                  if ((int)pgStack_e0 == 2) {
                    if (pgStack_118->to_free != (VARR_void_ptr_t *)0x0) {
                      pcStack_128 = (code *)0x16e54b;
                      (*(code *)pgStack_118->to_free)
                                (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),pgStack_110
                                );
                    }
                    *(gen_ctx **)(puVar1 + 2) = pgStack_108;
                    *(MIR_insn_t *)(puVar1 + 4) = pMStack_100;
                  }
                  pMVar41 = *(MIR_insn_t *)(puVar1 + 4);
                  pgVar61->ctx = *(MIR_context_t *)(puVar1 + 2);
                  ((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev = pMVar41;
                }
                return 1;
              }
            }
          }
          *(int *)&pgVar69->field_0xc = *(int *)&pgVar69->field_0xc + 1;
          pgVar55 = (gen_ctx *)((ulong)pgVar55 >> 0xb);
          uVar67 = (int)pgVar55 + 1 + uVar67 * 5;
          puVar72 = puVar73;
        } while( true );
      }
      goto LAB_0016e5ba;
    }
    pgVar75 = (gen_ctx_t)*puVar44;
    if (*(int *)&((DLIST_LINK_MIR_insn_t *)&pgVar25->optimize_level)->prev != (int)pgVar75)
    goto LAB_0016e3d9;
    pgVar58 = (gen_ctx_t)pVVar54->varr;
    pgVar55 = pgStack_110;
    pVVar74 = pVVar54;
    if (pgVar58 == (gen_ctx_t)0x0) goto LAB_0016e5c4;
    pMVar60 = (MIR_context_t)(ulong)((uint)pgVar49 * 2);
    if ((MIR_context_t)pVVar54->size != pMVar60) {
      pgVar55 = (gen_ctx *)((long)pMVar60 * 4);
      pcStack_128 = (code *)0x16e2c2;
      pMStack_f8 = pMVar60;
      pbVar27 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar55);
      pVVar54->varr = pbVar27;
      pVVar74 = pgStack_118->tied_regs;
      pVVar54->size = (size_t)pMStack_f8;
      pVVar54->els_num = (size_t)pMStack_f8;
      pgVar25 = pgStack_118;
      pMVar60 = pMStack_f8;
      pVVar54 = pVVar74;
      if (pVVar74 != (bitmap_t)0x0) goto LAB_0016e2ea;
      goto LAB_0016e5c9;
    }
    pVVar54->els_num = (size_t)pMVar60;
LAB_0016e2ea:
    if ((int)pMVar60 != 0) {
      pgVar58 = (gen_ctx_t)pVVar74->varr;
      pgVar55 = (gen_ctx *)0xff;
      pcStack_128 = (code *)0x16e307;
      memset(pgVar58,0xff,(ulong)((uint)pgVar49 & 0x7fffffff) << 3);
    }
    pVVar74 = (bitmap_t)(((anon_union_32_12_57d33f68_for_u *)&pgStack_118->addr_insn_p)->str).len;
    pgVar25 = pgStack_118;
    if ((pVVar74 == (bitmap_t)0x0) ||
       (pgVar58 = (gen_ctx_t)pVVar74->varr, pgVar58 == (gen_ctx_t)0x0)) goto LAB_0016e5bf;
    pgVar75 = (gen_ctx_t)(ulong)(uint)((int)pgVar75 * 2);
    if ((gen_ctx_t)pVVar74->size == pgVar75) {
      pVVar74->els_num = (size_t)pgVar75;
      pVVar54 = pVVar74;
LAB_0016e368:
      pbVar39 = pVVar54->varr;
      uVar67 = *(uint *)((long)&pgStack_118->ctx + 4);
      uVar66 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgStack_118->optimize_level)->prev;
      *(undefined4 *)&pgStack_118->ctx = 0;
      *(undefined4 *)&((DLIST_LINK_MIR_insn_t *)&pgStack_118->optimize_level)->prev = 0;
      *(undefined4 *)((long)&pgStack_118->ctx + 4) = 0;
      if (uVar67 < uVar66) {
        iVar37 = uVar66 - uVar67;
        pVVar54 = (bitmap_t)(pbVar39 + (ulong)uVar67 * 3 + 2);
        pgVar75 = pgStack_118;
        do {
          if ((int)pVVar54[-1].size != 0) {
            pcStack_128 = (code *)0x16e3ae;
            el.lr = (live_range_t_conflict)pVVar54->els_num;
            el._0_8_ = pVVar54[-1].varr;
            HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar75,el,HTAB_INSERT,(lr_gap_t *)pgVar61);
            pbVar39 = (bitmap_el_t *)pVVar54->els_num;
            pcStack_128 = (code *)0x16e3c9;
            (*(code *)((MIR_op_t *)&pgStack_118->debug_level)->data)
                      (pgVar61->ctx,((DLIST_LINK_MIR_insn_t *)&pgVar61->optimize_level)->prev,
                       pVVar54[-1].varr,pbVar39,pgStack_110);
            pgVar75 = pgStack_118;
          }
          pVVar54 = pVVar54 + 1;
          iVar37 = iVar37 + -1;
        } while (iVar37 != 0);
      }
      pgVar49 = (gen_ctx_t)((ulong)pMVar60 & 0xffffffff);
      goto LAB_0016e3d9;
    }
    pgVar55 = (gen_ctx *)((long)pgVar75 * 0x18);
    pcStack_128 = (code *)0x16e348;
    pbVar27 = (bitmap_el_t *)realloc(pgVar58,(size_t)pgVar55);
    pVVar74->varr = pbVar27;
    pVVar54 = (bitmap_t)(((anon_union_32_12_57d33f68_for_u *)&pgStack_118->addr_insn_p)->str).len;
    pVVar74->size = (size_t)pgVar75;
    pVVar74->els_num = (size_t)pgVar75;
    pgVar25 = pgStack_118;
    if (pVVar54 != (bitmap_t)0x0) goto LAB_0016e368;
  }
  pcStack_128 = rewrite_insn;
  HTAB_lr_gap_t_do_cold_2();
  pMVar26 = pgVar58->ctx;
  paStack_300 = (anon_union_32_12_57d33f68_for_u *)0x0;
  pcStack_3d0 = (code *)0x16e61a;
  pgStack_150 = pgVar75;
  pgStack_148 = pgVar69;
  pMStack_140 = pMVar60;
  pVStack_138 = pVVar54;
  pgStack_130 = pgVar61;
  pcStack_128 = (code *)uVar53;
  MIR_new_int_op(pMVar26,0);
  pcStack_3d0 = (code *)0x16e62c;
  MIR_new_int_op(pMVar26,0);
  pcStack_3d0 = (code *)0x16e637;
  sStack_2e8 = MIR_insn_nops(pMVar26,(MIR_insn_t_conflict)pgVar55);
  pMStack_2f8 = (MIR_op_t *)&pgVar55->debug_level;
  pMStack_2f0 = (MIR_insn_t_conflict)((long)&pgVar55->addr_regs + 4);
  uVar53 = CONCAT71((int7)((ulong)pgVar69 >> 8),1);
  uStack_30c = 0xffffffff;
  uStack_308 = 0xffffffff;
  do {
    if (sStack_2e8 != 0) {
      sVar64 = 0;
      pMVar30 = pMStack_2f0;
      do {
        pcStack_3d0 = (code *)0x16e6b0;
        MVar20 = MIR_insn_op_mode(pMVar26,(MIR_insn_t_conflict)pgVar55,sVar64,&iStack_304);
        iVar37 = iStack_304;
        if ((byte)uVar53 != 0) {
          if ((iStack_304 != 0) &&
             (cVar36 = *(char *)((long)&pMVar30[-1].ops[0].u + 4), cVar36 != '\v'))
          goto LAB_0016e6e9;
          goto LAB_0016eae5;
        }
        cVar36 = *(char *)((long)&pMVar30[-1].ops[0].u + 4);
        if (iStack_304 == 0) {
          iVar37 = 0;
        }
        else if (cVar36 != '\v') goto LAB_0016eae5;
LAB_0016e6e9:
        if (cVar36 != '\v') {
          if (cVar36 != '\x02') goto LAB_0016eae5;
          uVar52 = pMVar30[-1].ops[0].u.mem.nloc;
          uVar29 = (ulong)uVar52;
          if (uVar29 < 0x22) {
            pVVar54 = pgVar58->func_used_hard_regs;
            pcStack_3d0 = (code *)0x16e725;
            bitmap_expand(pVVar54,uVar29 + 1);
            if (pVVar54 != (bitmap_t)0x0) {
              *pVVar54->varr = *pVVar54->varr | 1L << (uVar29 & 0x3f);
              if (pbVar39 != (bitmap_el_t *)0x0) {
                pcStack_3d0 = (code *)0x16e757;
                update_live(pMVar30[-1].ops[0].u.mem.nloc,iStack_304,(bitmap_t)pbVar39[1]);
              }
              goto LAB_0016eae5;
            }
LAB_0016fce6:
            pcStack_3d0 = (code *)0x16fceb;
            rewrite_insn_cold_9();
            goto LAB_0016fceb;
          }
          if (iVar37 == 0) {
            pVVar9 = pgVar58->ra_ctx->reg_renumber;
            if (((pVVar9 != (VARR_MIR_reg_t *)0x0) && (pVVar9->varr != (MIR_reg_t *)0x0)) &&
               (uVar29 < pVVar9->els_num)) {
              paStack_300 = (anon_union_32_12_57d33f68_for_u *)
                            (ulong)((int)paStack_300 +
                                   (uint)(MVar20 - MIR_OP_REF < 0xfffffffd &&
                                         0x21 < pVVar9->varr[uVar29]));
              goto LAB_0016e909;
            }
LAB_0016fce1:
            pcStack_3d0 = (code *)0x16fce6;
            rewrite_insn_cold_8();
            goto LAB_0016fce6;
          }
LAB_0016e909:
          if (pbVar39 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
          pcStack_3d0 = (code *)0x16e91a;
          update_live(uVar52,iVar37,(bitmap_t)pbVar39[1]);
          plVar4 = (long *)pbVar39[2];
          if (plVar4 != (long *)0x0) {
            uVar52 = pMVar30[-1].ops[0].u.mem.nloc;
            uVar29 = (ulong)uVar52;
            if (((ulong)(*plVar4 << 6) <= uVar29) ||
               (uVar40 = (ulong)(uVar52 >> 6), uVar59 = *(ulong *)(plVar4[2] + uVar40 * 8),
               *(ulong *)(plVar4[2] + uVar40 * 8) = uVar59 & ~(1L << (uVar29 & 0x3f)),
               (uVar59 >> (uVar29 & 0x3f) & 1) == 0)) goto LAB_0016eae5;
            MVar22 = pMVar30[-1].ops[0].u.mem.nloc;
LAB_0016eac5:
            pgVar25 = (gen_ctx_t)&DAT_00000001;
            puVar65 = (undefined8 *)0x0;
            pcStack_3d0 = (code *)0x16eae5;
            spill_restore_reg(pgVar58,MVar22,base_reg,(MIR_insn_t)pgVar55,1,0);
            goto LAB_0016eae5;
          }
LAB_0016fcf5:
          pcStack_3d0 = (code *)0x16fcfa;
          rewrite_insn_cold_7();
LAB_0016fcfa:
          pcStack_3d0 = (code *)0x16fcff;
          rewrite_insn_cold_4();
LAB_0016fcff:
          pcStack_3d0 = (code *)0x16fd04;
          rewrite_insn_cold_2();
LAB_0016fd04:
          pcStack_3d0 = (code *)0x16fd09;
          rewrite_insn_cold_1();
          goto LAB_0016fd09;
        }
        uVar29 = (ulong)*(uint *)((long)&pMVar30[-1].ops[0].u + 0x1c);
        if (uVar29 < 0x22) {
          pVVar54 = pgVar58->func_used_hard_regs;
          pcStack_3d0 = (code *)0x16e788;
          bitmap_expand(pVVar54,uVar29 + 1);
          if (pVVar54 != (bitmap_t)0x0) {
            *pVVar54->varr = *pVVar54->varr | 1L << (uVar29 & 0x3f);
            goto LAB_0016e7aa;
          }
LAB_0016fceb:
          pcStack_3d0 = (code *)0x16fcf0;
          rewrite_insn_cold_6();
LAB_0016fcf0:
          pcStack_3d0 = (code *)0x16fcf5;
          rewrite_insn_cold_5();
          goto LAB_0016fcf5;
        }
LAB_0016e7aa:
        uVar29 = (ulong)*(uint *)&pMVar30->data;
        if (uVar29 < 0x22) {
          pVVar54 = pgVar58->func_used_hard_regs;
          pcStack_3d0 = (code *)0x16e7cd;
          bitmap_expand(pVVar54,uVar29 + 1);
          if (pVVar54 != (bitmap_t)0x0) {
            *pVVar54->varr = *pVVar54->varr | 1L << (uVar29 & 0x3f);
            goto LAB_0016e7ef;
          }
          goto LAB_0016fcf0;
        }
LAB_0016e7ef:
        uVar52 = *(uint *)((long)&pMVar30[-1].ops[0].u + 0x1c);
        uVar29 = (ulong)uVar52;
        if (uVar29 == 0xffffffff) {
          if (pbVar39 != (bitmap_el_t *)0x0) goto LAB_0016ea72;
          goto LAB_0016eae5;
        }
        uVar67 = *(uint *)&pMVar30->data;
        if (0xffffffdc < uVar67 - 0x22 || uVar52 < 0x22) goto LAB_0016e9fb;
        pVVar9 = pgVar58->ra_ctx->reg_renumber;
        if (((pVVar9 == (VARR_MIR_reg_t *)0x0) ||
            (pMVar6 = pVVar9->varr, pMVar6 == (MIR_reg_t *)0x0)) || (pVVar9->els_num <= uVar29)) {
          pcStack_3d0 = (code *)0x16fce1;
          rewrite_insn_cold_3();
          goto LAB_0016fce1;
        }
        if (0x21 < pMVar6[uVar29]) {
          if (pVVar9->els_num <= (ulong)uVar67) goto LAB_0016fd04;
          if (pMVar6[uVar67] < 0x22) goto LAB_0016e9fb;
          if (iStack_304 == 0) {
            bVar47 = -1 < (int)uStack_30c;
            uStack_30c = (uint)sVar64;
            uVar66 = uStack_308;
            if (bVar47) goto LAB_0016fd66;
          }
          else {
            bVar47 = -1 < (int)uStack_308;
            uStack_308 = (uint)sVar64;
            uVar66 = uStack_30c;
            if (bVar47) goto LAB_0016fd42;
          }
          if ((((int)uVar66 < 0) || (uVar52 != pMStack_2f8[uVar66].u.mem.base)) ||
             (uVar67 != pMStack_2f8[uVar66].u.mem.index)) {
            paStack_300 = (anon_union_32_12_57d33f68_for_u *)(ulong)((int)paStack_300 + 2);
          }
        }
LAB_0016e9fb:
        if (pbVar39 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
        pcStack_3d0 = (code *)0x16ea0f;
        update_live(uVar52,0,(bitmap_t)pbVar39[1]);
        uVar52 = *(uint *)((long)&pMVar30[-1].ops[0].u + 0x1c);
        uVar29 = (ulong)uVar52;
        if (0x21 < uVar29) {
          plVar4 = (long *)pbVar39[2];
          if (plVar4 != (long *)0x0) {
            if ((uVar29 < (ulong)(*plVar4 << 6)) &&
               (uVar40 = (ulong)(uVar52 >> 6), uVar59 = *(ulong *)(plVar4[2] + uVar40 * 8),
               *(ulong *)(plVar4[2] + uVar40 * 8) = uVar59 & ~(1L << (uVar29 & 0x3f)),
               (uVar59 >> (uVar29 & 0x3f) & 1) != 0)) {
              pgVar25 = (gen_ctx_t)&DAT_00000001;
              puVar65 = (undefined8 *)0x0;
              pcStack_3d0 = (code *)0x16ea72;
              spill_restore_reg(pgVar58,*(MIR_reg_t *)((long)&pMVar30[-1].ops[0].u + 0x1c),base_reg,
                                (MIR_insn_t)pgVar55,1,0);
            }
            goto LAB_0016ea72;
          }
          goto LAB_0016fcff;
        }
LAB_0016ea72:
        if (*(MIR_reg_t *)&pMVar30->data != 0xffffffff) {
          pcStack_3d0 = (code *)0x16ea84;
          update_live(*(MIR_reg_t *)&pMVar30->data,0,(bitmap_t)pbVar39[1]);
          uVar29 = (ulong)*(uint *)&pMVar30->data;
          if (uVar29 < 0x22) goto LAB_0016eae5;
          plVar4 = (long *)pbVar39[2];
          if (plVar4 != (long *)0x0) {
            if ((uVar29 < (ulong)(*plVar4 << 6)) &&
               (uVar40 = (ulong)(*(uint *)&pMVar30->data >> 6),
               uVar59 = *(ulong *)(plVar4[2] + uVar40 * 8),
               *(ulong *)(plVar4[2] + uVar40 * 8) = uVar59 & ~(1L << (uVar29 & 0x3f)),
               (uVar59 >> (uVar29 & 0x3f) & 1) != 0)) {
              MVar22 = *(MIR_reg_t *)&pMVar30->data;
              goto LAB_0016eac5;
            }
            goto LAB_0016eae5;
          }
          goto LAB_0016fcfa;
        }
LAB_0016eae5:
        sVar64 = sVar64 + 1;
        pMVar30 = (MIR_insn_t_conflict)&pMVar30->ops[0].u;
      } while (sStack_2e8 != sVar64);
    }
    if ((~(byte)uVar53 & 1) == 0 && pbVar39 != (bitmap_el_t *)0x0) {
      pcStack_3d0 = (code *)0x16eb29;
      target_get_early_clobbered_hard_regs
                ((MIR_insn_t)pgVar55->debug_file,(MIR_reg_t *)&MStack_278,(MIR_reg_t *)&MStack_2a8);
      if ((MIR_reg_t)MStack_278.data != 0xffffffff) {
        pcStack_3d0 = (code *)0x16eb43;
        update_live((MIR_reg_t)MStack_278.data,1,(bitmap_t)pbVar39[1]);
      }
      if ((MIR_reg_t)MStack_2a8.data != 0xffffffff) {
        pcStack_3d0 = (code *)0x16eb5d;
        update_live((MIR_reg_t)MStack_2a8.data,1,(bitmap_t)pbVar39[1]);
      }
      if (0xfffffffc < *(int *)&pgVar55->debug_file - 0xaaU) {
        pVVar54 = pgVar58->call_used_hard_regs[0x12];
        if (pVVar54 == (bitmap_t)0x0) goto LAB_0016fd3d;
        pgVar32 = (gen_ctx *)pgVar55->ctx;
        uVar29 = pVVar54->els_num;
        if (uVar29 != 0) {
          uVar40 = 0;
          uVar59 = 0;
          do {
            while ((pVVar54->varr[uVar40] == 0 ||
                   (uVar56 = pVVar54->varr[uVar40] >> (uVar59 & 0x3f), uVar56 == 0))) {
              uVar40 = uVar40 + 1;
              uVar59 = uVar40 * 0x40;
              if (uVar29 == uVar40) goto LAB_0016ebfd;
            }
            uVar29 = uVar56 & 1;
            uVar40 = uVar59;
            while (uVar29 == 0) {
              uVar40 = uVar40 + 1;
              uVar29 = uVar56 & 2;
              uVar56 = uVar56 >> 1;
            }
            uVar59 = uVar40 + 1;
            pcStack_3d0 = (code *)0x16ebee;
            update_live((MIR_reg_t)uVar40,1,(bitmap_t)pbVar39[1]);
            uVar29 = pVVar54->els_num;
            uVar40 = uVar59 >> 6;
          } while (uVar40 < uVar29);
        }
LAB_0016ebfd:
        pVVar54 = pgVar32->insn_to_consider;
        if (pVVar54 != (bitmap_t)0x0) {
          uVar29 = pVVar54->els_num;
          if (uVar29 != 0) {
            uVar40 = 0;
            uVar59 = 0;
            do {
              while ((pVVar54->varr[uVar40] == 0 ||
                     (uVar56 = pVVar54->varr[uVar40] >> (uVar59 & 0x3f), uVar56 == 0))) {
                uVar40 = uVar40 + 1;
                uVar59 = uVar40 * 0x40;
                if (uVar29 == uVar40) goto LAB_0016ec80;
              }
              uVar29 = uVar56 & 1;
              uVar40 = uVar59;
              while (uVar29 == 0) {
                uVar40 = uVar40 + 1;
                uVar29 = uVar56 & 2;
                uVar56 = uVar56 >> 1;
              }
              uVar59 = uVar40 + 1;
              pcStack_3d0 = (code *)0x16ec71;
              update_live((MIR_reg_t)uVar40,0,(bitmap_t)pbVar39[1]);
              uVar29 = pVVar54->els_num;
              uVar40 = uVar59 >> 6;
            } while (uVar40 < uVar29);
          }
LAB_0016ec80:
          puVar7 = (ulong *)pbVar39[1];
          if (puVar7 != (ulong *)0x0) {
            uVar29 = *puVar7;
            if (uVar29 != 0) {
              uVar40 = 0;
              uVar59 = 0;
              do {
                while ((uVar56 = *(ulong *)(puVar7[2] + uVar40 * 8), uVar56 == 0 ||
                       (uVar56 = uVar56 >> (uVar59 & 0x3f), uVar56 == 0))) {
                  uVar40 = uVar40 + 1;
                  uVar59 = uVar40 * 0x40;
                  if (uVar29 == uVar40) goto LAB_0016ee44;
                }
                uVar29 = uVar56 & 1;
                while (uVar29 == 0) {
                  uVar59 = uVar59 + 1;
                  uVar29 = uVar56 & 2;
                  uVar56 = uVar56 >> 1;
                }
                if (uVar59 < 0x22) goto LAB_0016ee26;
                plVar4 = *(long **)(*pbVar39 + 0x78);
                if (plVar4 == (long *)0x0) {
                  pcStack_3d0 = (code *)0x16fdc8;
                  rewrite_insn_cold_13();
                  goto LAB_0016fdc8;
                }
                uVar29 = uVar59 & 0xffffffff;
                uVar52 = (uint)uVar59;
                if (((ulong)(*plVar4 << 6) <= uVar29) ||
                   ((*(ulong *)(plVar4[2] + (uVar29 >> 6) * 8) >> (uVar59 & 0x3f) & 1) == 0)) {
                  pVVar9 = pgVar58->ra_ctx->reg_renumber;
                  if ((pVVar9 == (VARR_MIR_reg_t *)0x0) ||
                     ((pVVar9->varr == (MIR_reg_t *)0x0 || (pVVar9->els_num <= uVar29)))) {
                    pcStack_3d0 = (code *)0x16fd66;
                    rewrite_insn_cold_12();
LAB_0016fd66:
                    pcStack_3d0 = (code *)0x16fd85;
                    __assert_fail("in_mem_op_num < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x1f5f,
                                  "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                 );
                  }
                  pMVar41 = (MIR_insn_t)(ulong)pVVar9->varr[uVar29];
                  if (pMVar41 < (MIR_insn_t)0x22) {
                    pcStack_3d0 = (code *)0x16ed85;
                    pMStack_2e0 = pMVar41;
                    MIR_reg_type(pgVar58->ctx,uVar52 - 0x21,(pgVar58->curr_func_item->u).func);
                    pVVar54 = pgVar58->call_used_hard_regs[0x12];
                    if (pVVar54 == (bitmap_t)0x0) {
                      pcStack_3d0 = (code *)0x16fdfe;
                      rewrite_insn_cold_11();
                      goto LAB_0016fdfe;
                    }
                    pMVar41 = (MIR_insn_t)(pVVar54->els_num << 6);
                    if ((pMStack_2e0 < pMVar41) &&
                       ((*pVVar54->varr >> ((ulong)pMStack_2e0 & 0x3f) & 1) != 0)) {
                      pgVar69 = (gen_ctx_t)pbVar39[2];
                      sVar64 = uVar29 + 1;
                      pcStack_3d0 = (code *)0x16edce;
                      pgVar61 = pgVar69;
                      bitmap_expand((bitmap_t)pgVar69,sVar64);
                      iVar37 = (int)pgVar25;
                      iVar63 = (int)puVar65;
                      if (pgVar69 == (gen_ctx_t)0x0) {
                        pcStack_3d0 = spill_restore_reg;
                        rewrite_insn_cold_10();
                        pMVar60 = pgVar61->ctx;
                        MVar22 = (int)sVar64 - 0x21;
                        puStack_3f8 = puVar7;
                        uStack_3f0 = uVar53;
                        pbStack_3e8 = pbVar39;
                        uStack_3e0 = uVar59;
                        pgStack_3d8 = pgVar69;
                        pcStack_3d0 = (code *)uVar29;
                        MVar21 = MIR_reg_type(pMVar60,MVar22,(pgVar61->curr_func_item->u).func);
                        if (MVar21 == MIR_T_F) {
                          MVar20 = MIR_OP_FLOAT;
                        }
                        else if (MVar21 == MIR_T_D) {
                          MVar20 = MIR_OP_DOUBLE;
                        }
                        else {
                          MVar20 = (uint)(MVar21 == MIR_T_LD) * 4 + MIR_OP_INT;
                        }
                        prVar28 = pgVar61->ra_ctx;
                        pVVar9 = prVar28->reg_renumber;
                        if (((pVVar9 == (VARR_MIR_reg_t *)0x0) || (pVVar9->varr == (MIR_reg_t *)0x0)
                            ) || (uVar53 = sVar64 & 0xffffffff, pVVar9->els_num <= uVar53))
                        goto LAB_0017022a;
                        uVar52 = pVVar9->varr[uVar53];
                        if (0x21 < uVar52) goto LAB_00170258;
                        pVVar57 = prVar28->used_locs;
                        if (pVVar57 == (VARR_bitmap_t *)0x0) {
                          spill_restore_reg_cold_6();
LAB_0017027c:
                          spill_restore_reg_cold_5();
                        }
                        else {
                          pVVar10 = prVar28->spill_cache;
                          if (pVVar10 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
                          if (((int)sVar64 == -1) || (pVVar10->els_num <= uVar53))
                          goto LAB_0017022f;
                          psVar11 = pVVar10->varr;
                          if (psVar11[uVar53].age == prVar28->spill_cache_age) {
                            MStack_478 = psVar11[uVar53].slot;
                            goto LAB_0017019a;
                          }
                          pVVar54 = prVar28->conflict_locs1;
                          if ((pVVar54 != (bitmap_t)0x0) && (pVVar54->varr != (bitmap_el_t *)0x0)) {
                            ppVVar12 = pVVar57->varr;
                            pMVar60 = pgVar61->ctx;
                            pVVar54->els_num = 0;
                            pVVar13 = pgVar61->lr_ctx->var_live_ranges;
                            if ((pVVar13 == (VARR_live_range_t *)0x0) ||
                               ((pVVar13->varr == (live_range_t_conflict *)0x0 ||
                                (pVVar13->els_num <= uVar53)))) {
                              spill_restore_reg_cold_3();
                            }
                            else {
                              for (plVar34 = pVVar13->varr[uVar53];
                                  plVar34 != (live_range_t_conflict)0x0; plVar34 = plVar34->next) {
                                if (plVar34->start <= plVar34->finish) {
                                  lVar42 = (long)plVar34->start + -1;
                                  do {
                                    bitmap_ior(pVVar54,pVVar54,ppVVar12[lVar42 + 1]);
                                    lVar42 = lVar42 + 1;
                                  } while (lVar42 < plVar34->finish);
                                }
                              }
                              MVar21 = MIR_reg_type(pMVar60,MVar22,(pgVar61->curr_func_item->u).func
                                                   );
                              MStack_478 = get_stack_loc(pgVar61,pgVar61->ra_ctx->start_mem_loc,
                                                         MVar21,pVVar54,(int *)&MStack_430);
                              psVar11[uVar53].slot = MStack_478;
                              psVar11[uVar53].age = pgVar61->ra_ctx->spill_cache_age;
                              pVVar13 = pgVar61->lr_ctx->var_live_ranges;
                              if (((pVVar13 != (VARR_live_range_t *)0x0) &&
                                  (pVVar13->varr != (live_range_t_conflict *)0x0)) &&
                                 (uVar53 < pVVar13->els_num)) {
                                plVar34 = pVVar13->varr[uVar53];
                                if (plVar34 != (live_range_t_conflict)0x0) {
                                  do {
                                    iVar23 = plVar34->finish;
                                    lVar42 = (long)plVar34->start;
                                    if (plVar34->start <= iVar23) {
                                      do {
                                        uVar53 = (ulong)(uint)MStack_430.data;
                                        MVar22 = MStack_478;
                                        if (0 < (int)(uint)MStack_430.data) {
                                          do {
                                            pVVar54 = ppVVar12[lVar42];
                                            bitmap_expand(pVVar54,(ulong)MVar22 + 1);
                                            if (pVVar54 == (bitmap_t)0x0) {
                                              spill_restore_reg_cold_1();
                                              goto LAB_0017022a;
                                            }
                                            pVVar54->varr[MVar22 >> 6] =
                                                 pVVar54->varr[MVar22 >> 6] |
                                                 1L << ((ulong)MVar22 & 0x3f);
                                            MVar22 = MVar22 + 1;
                                            uVar53 = uVar53 - 1;
                                          } while (uVar53 != 0);
                                          iVar23 = plVar34->finish;
                                        }
                                        bVar47 = lVar42 < iVar23;
                                        lVar42 = lVar42 + 1;
                                      } while (bVar47);
                                    }
                                    plVar34 = plVar34->next;
                                  } while (plVar34 != (live_range_t)0x0);
                                }
LAB_0017019a:
                                if (((FILE *)pgVar61->debug_file != (FILE *)0x0) &&
                                   (1 < pgVar61->debug_level)) {
                                  pcVar46 = "Restore";
                                  if (iVar63 == 0) {
                                    pcVar46 = "Spill";
                                  }
                                  fprintf((FILE *)pgVar61->debug_file,"    %s r%d:",pcVar46,sVar64);
                                }
                                MVar22 = add_ld_st(pgVar61,&MStack_430,MStack_478,base_reg_00,MVar20
                                                   ,uVar52,(uint)(iVar63 == 0),10,pMVar41,iVar37);
                                return MVar22;
                              }
                            }
                            spill_restore_reg_cold_2();
LAB_00170258:
                            __assert_fail("hard_reg <= ST1_HARD_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1eb0,
                                          "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)"
                                         );
                          }
                        }
                        iVar63 = (int)pVVar57;
                        iVar37 = (int)sVar64;
                        spill_restore_reg_cold_4();
                        p_Var51 = (MIR_error_func_t)((ulong)pMVar60 & 0xffffffff);
                        if (iVar63 == 0) {
                          nb = p_Var51 + 1;
                          pMVar26 = bm;
                          bitmap_expand((bitmap_t)bm,(size_t)nb);
                          iVar63 = (int)nb;
                          if (bm != (MIR_context_t)0x0) {
                            p_Var35 = bm->error_func;
                            *(ulong *)(p_Var35 + ((ulong)p_Var51 >> 6) * 8) =
                                 *(ulong *)(p_Var35 + ((ulong)p_Var51 >> 6) * 8) |
                                 1L << ((ulong)pMVar60 & 0x3f);
                            goto LAB_001702e7;
                          }
                        }
                        else {
                          if (bm != (MIR_context_t)0x0) {
                            p_Var35 = (MIR_error_func_t)((long)bm->gen_ctx << 6);
                            if (p_Var51 < p_Var35) {
                              p_Var35 = bm->error_func;
                              bVar3 = (byte)p_Var51 & 0x3f;
                              *(ulong *)(p_Var35 + ((ulong)p_Var51 >> 6) * 8) =
                                   *(ulong *)(p_Var35 + ((ulong)p_Var51 >> 6) * 8) &
                                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                            }
LAB_001702e7:
                            return (MIR_reg_t)p_Var35;
                          }
                          update_live_cold_1();
                          pMVar26 = pMVar60;
                        }
                        update_live_cold_2();
                        pvVar8 = pMVar26[1].environment_module.data;
                        lVar42 = 0x1e8;
                        uVar53 = (ulong)(iVar37 != 0);
                        if (iVar37 == 0) {
                          lVar42 = 0x188;
                        }
                        iVar37 = *(int *)((long)pvVar8 + uVar53 * 4 + 0x180);
                        lVar62 = (long)iVar37;
                        if (lVar62 < 1) {
                          uVar67 = 0;
                          goto LAB_001703e4;
                        }
                        uVar52 = extraout_EDX - 8;
                        lVar68 = 0;
                        uVar67 = 0;
                        goto LAB_00170360;
                      }
                      pvVar8 = (&pgVar69->curr_func_item->data)[uVar52 >> 6];
                      (&pgVar69->curr_func_item->data)[uVar52 >> 6] =
                           (void *)((ulong)pvVar8 | 1L << (uVar59 & 0x3f));
                      if (((ulong)pvVar8 >> (uVar59 & 0x3f) & 1) == 0) {
                        pgVar25 = (gen_ctx_t)&DAT_00000001;
                        puVar65 = (undefined8 *)&DAT_00000001;
                        pcStack_3d0 = (code *)0x16ee26;
                        spill_restore_reg(pgVar58,uVar52,base_reg,(MIR_insn_t)pgVar55,1,1);
                      }
                    }
                  }
                }
LAB_0016ee26:
                uVar29 = *puVar7;
                uVar59 = uVar59 + 1;
                uVar40 = uVar59 >> 6;
              } while (uVar40 < uVar29);
            }
            goto LAB_0016ee44;
          }
          pcStack_3d0 = (code *)0x16fd38;
          rewrite_insn_cold_14();
        }
        pcStack_3d0 = (code *)0x16fd3d;
        rewrite_insn_cold_15();
LAB_0016fd3d:
        pcStack_3d0 = (code *)0x16fd42;
        rewrite_insn_cold_16();
LAB_0016fd42:
        pcStack_3d0 = (code *)0x16fd61;
        __assert_fail("out_mem_op_num < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f5b,
                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
      }
    }
LAB_0016ee44:
    uVar29 = uVar53 & 1;
    uVar53 = 0;
  } while (uVar29 != 0);
  prVar28 = pgVar58->ra_ctx;
  prVar28->in_reloads_num = 0;
  prVar28->out_reloads_num = 0;
  if ((int)(MIR_reg_t)paStack_300 < 3) {
LAB_0016f25c:
    pFVar50 = pgVar55->debug_file;
    if (0xfffffffb < (int)pFVar50 - 0x22U) {
      if (*(char *)&pgVar55->temp_bitmap2 != '\x02') {
        pcStack_3d0 = (code *)0x16fe3c;
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar52 = *(uint *)&((DLIST_MIR_item_t *)&pgVar55->temp_bitmap3)->head;
      if (0xffffffdc < uVar52 - 0x22) {
        pcStack_3d0 = (code *)0x16fe5b;
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar9 = pgVar58->ra_ctx->reg_renumber;
      if (((pVVar9 == (VARR_MIR_reg_t *)0x0) || (pVVar9->varr == (MIR_reg_t *)0x0)) ||
         (pVVar9->els_num <= (ulong)uVar52)) goto LAB_0016fdd2;
      uVar67 = pVVar9->varr[uVar52];
      pMVar60 = pgVar58->ctx;
      pcStack_3d0 = (code *)0x16f2c9;
      MVar21 = MIR_reg_type(pMVar60,uVar52 - 0x21,(pgVar58->curr_func_item->u).func);
      if (uVar67 < 0x22) {
        pcStack_3d0 = (code *)0x16fe7a;
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar67 = uVar67 - 0x22;
      if (pgVar58->target_ctx->keep_fp_p == '\0') {
        lVar42 = (ulong)uVar67 << 3;
      }
      else {
        lVar42 = -0xb0;
        if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
          lVar42 = 0;
        }
        lVar42 = lVar42 + (ulong)((MVar21 == MIR_T_LD) + 1 + uVar67) * -8;
      }
      pcStack_3d0 = (code *)0x16f32b;
      MVar22 = get_reload_hreg(pgVar58,0xffffffff,6,0);
      pcStack_3d0 = (code *)0x16f345;
      _MIR_new_var_op(pMVar60,MVar22);
      pcStack_3d0 = (code *)0x16f350;
      iVar31 = _MIR_addr_offset(pMVar60,*(MIR_insn_code_t *)&pgVar55->debug_file);
      pcStack_3d0 = (code *)0x16f369;
      MIR_new_int_op(pMVar60,lVar42 + iVar31);
      pcStack_3d0 = (code *)0x16f3a5;
      pMStack_2f0 = MIR_new_insn(pMVar60,MIR_MOV);
      pcStack_3d0 = (code *)0x16f3c2;
      _MIR_new_var_op(pMVar60,MVar22);
      paStack_300 = (anon_union_32_12_57d33f68_for_u *)CONCAT44(paStack_300._4_4_,MVar22);
      pcStack_3d0 = (code *)0x16f3de;
      _MIR_new_var_op(pMVar60,MVar22);
      pcStack_3d0 = (code *)0x16f3f8;
      _MIR_new_var_op(pMVar60,base_reg);
      pMVar30 = pMStack_2f0;
      pcStack_3d0 = (code *)0x16f45e;
      insn = MIR_new_insn(pMVar60,MIR_ADD);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        if (pgVar58->optimize_level == 0) {
          uVar52 = *(int *)&pgVar55->debug_file - 0xa7;
          pgVar32 = pgVar55;
          if ((uVar52 < 0xe) && ((0x2007U >> (uVar52 & 0x1f) & 1) != 0)) {
            pgVar32 = (gen_ctx *)pgVar55->ctx;
          }
        }
        else {
          pgVar32 = (gen_ctx *)&((gen_ctx *)pgVar55->ctx)->addr_insn_p;
        }
        pcStack_3d0 = (code *)0x16f4c2;
        fprintf((FILE *)pgVar58->debug_file,"    Adding before insn (in BB %lu) ",
                ((gen_ctx *)pgVar32->ctx)->ctx);
        pcStack_3d0 = (code *)0x16f4e6;
        MIR_output_insn(pMVar60,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,0);
        pcStack_3d0 = (code *)0x16f501;
        fwrite(":\n      ",8,1,(FILE *)pgVar58->debug_file);
        pcStack_3d0 = (code *)0x16f520;
        MIR_output_insn(pMVar60,pgVar58->debug_file,pMVar30,(pgVar58->curr_func_item->u).func,1);
        pcStack_3d0 = (code *)0x16f53b;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_3d0 = (code *)0x16f55a;
        MIR_output_insn(pMVar60,pgVar58->debug_file,insn,(pgVar58->curr_func_item->u).func,1);
      }
      pcStack_3d0 = (code *)0x16f56c;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar30);
      pcStack_3d0 = (code *)0x16f57a;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,insn);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_3d0 = (code *)0x16f5a4;
        fwrite("Changing ",9,1,(FILE *)pgVar58->debug_file);
        pcStack_3d0 = (code *)0x16f5be;
        MIR_output_insn(pMVar60,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar55->debug_file = 0;
      pcStack_3d0 = (code *)0x16f5df;
      _MIR_new_var_op(pMVar60,(MIR_reg_t)paStack_300);
      pgVar55->temp_bitmap3 = (bitmap_t)auStack_1a8._0_8_;
      pgVar55->call_used_hard_regs[0] = (bitmap_t)auStack_1a8._8_8_;
      pgVar55->call_used_hard_regs[1] = (bitmap_t)auStack_198._0_8_;
      pgVar55->call_used_hard_regs[2] = (bitmap_t)auStack_198._8_8_;
      pgVar55->temp_bitmap = (bitmap_t)auStack_1b8._0_8_;
      pgVar55->temp_bitmap2 = (bitmap_t)auStack_1b8._8_8_;
      pgVar55->temp_bitmap3 = (bitmap_t)auStack_1a8._0_8_;
      pgVar55->call_used_hard_regs[0] = (bitmap_t)auStack_1a8._8_8_;
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_3d0 = (code *)0x16f61c;
        fwrite(" to ",4,1,(FILE *)pgVar58->debug_file);
        pcStack_3d0 = (code *)0x16f639;
        MIR_output_insn(pMVar60,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                        (pgVar58->curr_func_item->u).func,1);
      }
      pFVar50 = pgVar55->debug_file;
    }
    if (sStack_2e8 != 0) {
      paStack_300 = (anon_union_32_12_57d33f68_for_u *)&pgVar55->addr_insn_p;
      pMVar30 = (MIR_insn_t_conflict)(ulong)((int)pFVar50 - 0xaa);
      sVar64 = 0;
      pMStack_2f0 = pMVar30;
      do {
        pMVar71 = pMStack_2f8 + sVar64;
        pcStack_3d0 = (code *)0x16f69f;
        MVar20 = MIR_insn_op_mode(pMVar26,(MIR_insn_t_conflict)pgVar55,sVar64,&iStack_304);
        if ((pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          auVar2 = *(undefined1 (*) [32])pMVar71;
          pauVar33 = (undefined1 (*) [32])apvStack_248;
          if (iStack_304 == 0) {
            pauVar33 = (undefined1 (*) [32])&pVStack_218;
          }
          *(anon_union_32_12_57d33f68_for_u *)(*pauVar33 + 0x10) = pMVar71->u;
          *pauVar33 = auVar2;
        }
        if (pMVar71->field_0x8 == '\v') {
          if (((uint)pMVar30 < 0xfffffffd) || (*(byte *)&pMVar71->u - 0x11 < 0xfffffffb)) {
            MVar22 = *(MIR_reg_t *)((long)&pMVar71->u + 0x10);
            if (0x22 < MVar22 + 1) {
              pcStack_3d0 = (code *)0x16f7dc;
              MVar22 = change_reg(pgVar58,&MStack_2d8,MVar22,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar55
                                  ,0);
              *(MIR_reg_t *)((long)&pMVar71->u + 0x10) = MVar22;
              if (MVar22 == 0xffffffff) {
                pcStack_3d0 = (code *)0x16fda4;
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar22 = (pMVar71->u).mem.index;
            if (0x22 < MVar22 + 1) {
              pcStack_3d0 = (code *)0x16f82f;
              MVar22 = change_reg(pgVar58,&MStack_2d8,MVar22,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar55
                                  ,0);
              (pMVar71->u).mem.index = MVar22;
              if (MVar22 == 0xffffffff) {
                pcStack_3d0 = (code *)0x16fdc3;
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((pMVar71->field_0x8 == '\x02') && (0x21 < (pMVar71->u).reg)) {
          if (MVar20 == MIR_OP_VAR) {
            if ((*(int *)&pgVar55->debug_file != 0xb9) &&
               ((sVar64 != 1 || (3 < *(int *)&pgVar55->debug_file - 0x1eU)))) goto LAB_0016fdd7;
            pcStack_3d0 = (code *)0x16f767;
            MVar21 = MIR_reg_type(pMVar26,(pMVar71->u).reg - 0x21,(pgVar58->curr_func_item->u).func)
            ;
            if (MVar21 == MIR_T_F) {
              MVar20 = MIR_OP_FLOAT;
            }
            else if (MVar21 == MIR_T_D) {
              MVar20 = MIR_OP_DOUBLE;
            }
            else {
              MVar20 = (uint)(MVar21 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar9 = pgVar58->ra_ctx->reg_renumber;
          if (((pVVar9 == (VARR_MIR_reg_t *)0x0) || (pVVar9->varr == (MIR_reg_t *)0x0)) ||
             (pVVar9->els_num <= (ulong)(pMVar71->u).reg)) {
LAB_0016fd09:
            pcStack_3d0 = (code *)0x16fd11;
            rewrite_insn_cold_18();
LAB_0016fd11:
            pcStack_3d0 = (code *)0x16fd33;
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar64 == 0) && (*(int *)&pgVar55->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar52 = pVVar9->varr[(pMVar71->u).reg], 0x21 < uVar52)) {
            pMVar60 = pgVar58->ctx;
            pcStack_3d0 = (code *)0x16f8ea;
            MVar21 = MIR_reg_type(pMVar60,paStack_300->reg - 0x21,(pgVar58->curr_func_item->u).func)
            ;
            uVar52 = uVar52 - 0x22;
            if (pgVar58->target_ctx->keep_fp_p == '\0') {
              MVar43 = (ulong)uVar52 << 3;
            }
            else {
              lVar42 = -0xb0;
              if (((pgVar58->curr_func_item->u).func)->vararg_p == '\0') {
                lVar42 = 0;
              }
              MVar43 = lVar42 + (ulong)((MVar21 == MIR_T_LD) + 1 + uVar52) * -8;
            }
            auVar2 = *(undefined1 (*) [32])pMStack_2f8;
            MVar22 = ((anon_union_32_12_57d33f68_for_u *)&pgVar55->addr_insn_p)->reg;
            MStack_278.u._16_8_ = SUB328((pMStack_2f8->u).mem,0x10);
            MStack_278.u.mem.disp = (pMStack_2f8->u).mem.disp;
            MStack_278.data._0_4_ = auVar2._0_4_;
            MStack_278.data._4_4_ = auVar2._4_4_;
            MStack_278._8_8_ = auVar2._8_8_;
            MStack_278.u.i = auVar2._16_8_;
            MStack_278.u.str.s = auVar2._24_8_;
            pcStack_3d0 = (code *)0x16f98d;
            _MIR_new_var_mem_op(&MStack_2a8,pMVar60,MVar21,MVar43,base_reg,0xffffffff,'\0');
            pMVar30 = pMStack_2f0;
            pFVar50 = pgVar55->debug_file;
            if ((int)((ulong)pFVar50 >> 0x20) < 1) {
              pcStack_3d0 = (code *)0x16fa3c;
              iVar37 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar55,(int *)0x0);
              pMVar30 = pMStack_2f0;
              if (iVar37 < 0) goto LAB_0016faa5;
            }
            else {
              uVar53 = 0;
              uVar52 = 0;
              paVar45 = paStack_300;
              do {
                if ((*(char *)((long)paVar45 + -8) == '\x02') && (paVar45->reg == MVar22)) {
                  auVar2._4_4_ = MStack_2a8.data._4_4_;
                  auVar2._0_4_ = (MIR_reg_t)MStack_2a8.data;
                  auVar2._8_8_ = MStack_2a8._8_8_;
                  auVar2._16_8_ = MStack_2a8.u.i;
                  auVar2._24_8_ = MStack_2a8.u.str.s;
                  aVar17.str.s = MStack_2a8.u.str.s;
                  aVar17.i = MStack_2a8.u.i;
                  aVar17._16_8_ = MStack_2a8.u._16_8_;
                  aVar17.mem.disp = MStack_2a8.u.mem.disp;
                  *paVar45 = aVar17;
                  *(undefined1 (*) [32])((long)paVar45 + -0x10) = auVar2;
                  if (1 < (int)uVar52) goto LAB_0016fd11;
                  lVar42 = (long)(int)uVar52;
                  uVar52 = uVar52 + 1;
                  aiStack_1e8[lVar42] = (int)uVar53;
                }
                uVar53 = uVar53 + 1;
                paVar45 = (anon_union_32_12_57d33f68_for_u *)((long)paVar45 + 0x30);
              } while ((ulong)pFVar50 >> 0x20 != uVar53);
              pcStack_3d0 = (code *)0x16fa19;
              iVar37 = find_insn_pattern(pgVar58,(MIR_insn_t)pgVar55,(int *)0x0);
              if (iVar37 < 0) {
                if (0 < (int)uVar52) {
                  uVar53 = 0;
                  do {
                    iVar37 = aiStack_1e8[uVar53];
                    auVar18._4_4_ = MStack_278.data._4_4_;
                    auVar18._0_4_ = (MIR_reg_t)MStack_278.data;
                    auVar18._8_8_ = MStack_278._8_8_;
                    auVar18._16_8_ = MStack_278.u.i;
                    auVar18._24_8_ = MStack_278.u.str.s;
                    aVar19.str.s = MStack_278.u.str.s;
                    aVar19.i = MStack_278.u.i;
                    aVar19._16_8_ = MStack_278.u._16_8_;
                    aVar19.mem.disp = MStack_278.u.mem.disp;
                    uVar53 = uVar53 + 1;
                    pMStack_2f8[iVar37].u = aVar19;
                    *(undefined1 (*) [32])(pMStack_2f8 + iVar37) = auVar18;
                  } while (uVar52 != uVar53);
                }
                goto LAB_0016faa5;
              }
            }
          }
          else {
LAB_0016faa5:
            pcStack_3d0 = (code *)0x16fade;
            MVar22 = change_reg(pgVar58,&MStack_2d8,(pMVar71->u).reg,base_reg,MVar20,
                                (MIR_insn_t)pgVar55,iStack_304);
            if (MVar22 == 0xffffffff) {
              auVar15._8_8_ = MStack_2d8._8_8_;
              auVar15._0_8_ = MStack_2d8.data;
              auVar15._16_8_ = MStack_2d8.u.i;
              auVar15._24_8_ = MStack_2d8.u.str.s;
              aVar16.str.s = MStack_2d8.u.str.s;
              aVar16.i = MStack_2d8.u.i;
              aVar16._16_8_ = MStack_2d8.u._16_8_;
              aVar16.mem.disp = MStack_2d8.u.mem.disp;
              pMVar71->u = aVar16;
              *(undefined1 (*) [32])pMVar71 = auVar15;
            }
            else {
              (pMVar71->u).reg = MVar22;
            }
          }
        }
        sVar64 = sVar64 + 1;
      } while (sVar64 != sStack_2e8);
      pFVar50 = pgVar55->debug_file;
    }
    pMVar71 = pMStack_2f8;
    MVar22 = 0;
    if (((ulong)pFVar50 & 0xfffffffc) == 0) {
      uVar14 = *(undefined8 *)((long)&pMStack_2f8->u + 8);
      pcStack_3d0 = (code *)0x16fb85;
      op1_00._12_4_ = (int)((ulong)*(undefined8 *)&pMStack_2f8->field_0x8 >> 0x20);
      op1_00.data = pMStack_2f8->data;
      op1_00._8_4_ = *(undefined4 *)&pMStack_2f8->field_0x8;
      op1_00.u.i = (pMStack_2f8->u).i;
      op1_00.u.mem.nonalias = (int)uVar14;
      op1_00.u.mem.nloc = (int)((ulong)uVar14 >> 0x20);
      op1_00.u._16_8_ = *(undefined8 *)((long)&pMStack_2f8->u + 0x10);
      op1_00.u.mem.disp = (pMStack_2f8->u).mem.disp;
      iVar37 = MIR_op_eq_p(pMVar26,op1_00,*(MIR_op_t *)&pgVar55->temp_bitmap);
      MVar22 = 0;
      if (iVar37 != 0) {
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_3d0 = (code *)0x16fbc7;
          fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar58->debug_file);
          pcStack_3d0 = (code *)0x16fbe9;
          MIR_output_insn(pMVar26,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                          (pgVar58->curr_func_item->u).func,0);
          pcStack_3d0 = (code *)0x16fc03;
          fwrite(" which was ",0xb,1,(FILE *)pgVar58->debug_file);
          (pMVar71->u).i = iStack_238;
          (pMVar71->u).str.s = pcStack_230;
          *(undefined8 *)((long)&pMVar71->u + 0x10) = uStack_228;
          (pMVar71->u).mem.disp = MStack_220;
          pMVar71->data = apvStack_248[0];
          *(void **)&pMVar71->field_0x8 = apvStack_248[1];
          (pMVar71->u).i = iStack_238;
          (pMVar71->u).str.s = pcStack_230;
          pgVar55->temp_bitmap3 = pVStack_208;
          pgVar55->call_used_hard_regs[0] = pVStack_200;
          pgVar55->call_used_hard_regs[1] = pVStack_1f8;
          pgVar55->call_used_hard_regs[2] = pVStack_1f0;
          pgVar55->temp_bitmap = pVStack_218;
          pgVar55->temp_bitmap2 = pVStack_210;
          pgVar55->temp_bitmap3 = pVStack_208;
          pgVar55->call_used_hard_regs[0] = pVStack_200;
          pcStack_3d0 = (code *)0x16fc5d;
          MIR_output_insn(pMVar26,pgVar58->debug_file,(MIR_insn_t_conflict)pgVar55,
                          (pgVar58->curr_func_item->u).func,1);
        }
        if ((((pgVar58->optimize_level != 0) &&
             (pMVar60 = pgVar55->ctx, pMVar60 != (MIR_context_t)0x0)) &&
            ((MIR_context_t)pMVar60->temp_string[3].size == pMVar60)) &&
           ((MIR_context_t)pMVar60->temp_string[3].varr == pMVar60)) {
          pcStack_3d0 = (code *)0x16fc8e;
          pMVar30 = MIR_new_insn_arr(pgVar58->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          pcStack_3d0 = (code *)0x16fca4;
          MIR_insert_insn_before
                    (pgVar58->ctx,pgVar58->curr_func_item,(MIR_insn_t_conflict)pMVar60->gen_ctx,
                     pMVar30);
          pcStack_3d0 = (code *)0x16fcb5;
          add_new_bb_insn(pgVar58,pMVar30,(bb_t_conflict)pMVar60->temp_string,0);
        }
        pcStack_3d0 = (code *)0x16fcc0;
        gen_delete_insn(pgVar58,(MIR_insn_t)pgVar55);
        MVar22 = 1;
      }
    }
    return MVar22;
  }
  if ((int)(uStack_30c & uStack_308) < 0) {
LAB_0016fdfe:
    pcStack_3d0 = (code *)0x16fe1d;
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar60 = pgVar58->ctx;
  uVar53 = (ulong)uStack_30c;
  paVar45 = (anon_union_32_12_57d33f68_for_u *)(ulong)uStack_308;
  uVar52 = uStack_30c;
  if (-1 < (int)uStack_308) {
    uVar52 = uStack_308;
  }
  uVar29 = (ulong)pMStack_2f8[(int)uVar52].u.mem.base;
  uVar59 = (ulong)pMStack_2f8[(int)uVar52].u.mem.index;
  if (-1 < (int)(uStack_30c | uStack_308)) {
    pMVar71 = pMStack_2f8 + uVar53;
    uVar14 = *(undefined8 *)((long)&pMVar71->u + 8);
    pcStack_3d0 = (code *)0x16ef15;
    op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar71->field_0x8 >> 0x20);
    op1.data = pMVar71->data;
    op1._8_4_ = *(undefined4 *)&pMVar71->field_0x8;
    op1.u.i = (pMVar71->u).i;
    op1.u.mem.nonalias = (int)uVar14;
    op1.u.mem.nloc = (int)((ulong)uVar14 >> 0x20);
    op1.u._16_8_ = *(undefined8 *)((long)&pMStack_2f8[uVar53].u + 0x10);
    op1.u.mem.disp = pMStack_2f8[uVar53].u.mem.disp;
    op2.u._16_8_ = *(undefined8 *)((long)&pMStack_2f8[(long)paVar45].u + 0x10);
    op2._0_32_ = *(undefined1 (*) [32])(pMStack_2f8 + (long)paVar45);
    op2.u.mem.disp = pMStack_2f8[(long)paVar45].u.mem.disp;
    iVar37 = MIR_op_eq_p(pMVar60,op1,op2);
    if (iVar37 == 0) {
      pcStack_3d0 = (code *)0x16fe99;
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    prVar28 = pgVar58->ra_ctx;
  }
  pVVar9 = prVar28->reg_renumber;
  paStack_300 = paVar45;
  if (((pVVar9 == (VARR_MIR_reg_t *)0x0) || (pVVar9->varr == (MIR_reg_t *)0x0)) ||
     (pVVar9->els_num <= uVar29)) {
LAB_0016fdc8:
    pcStack_3d0 = (code *)0x16fdcd;
    rewrite_insn_cold_20();
  }
  else {
    pcStack_3d0 = (code *)0x16efa3;
    add_ld_st(pgVar58,&MStack_278,pVVar9->varr[uVar29],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar55,0);
    pMVar71 = pMStack_2f8;
    pVVar9 = pgVar58->ra_ctx->reg_renumber;
    if (((pVVar9 != (VARR_MIR_reg_t *)0x0) && (pVVar9->varr != (MIR_reg_t *)0x0)) &&
       (uVar59 < pVVar9->els_num)) {
      pcStack_3d0 = (code *)0x16f01f;
      add_ld_st(pgVar58,&MStack_278,pVVar9->varr[uVar59],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar55,0);
      pcStack_3d0 = (code *)0x16f034;
      _MIR_new_var_op(pMVar60,10);
      pcStack_3d0 = (code *)0x16f049;
      _MIR_new_var_op(pMVar60,0xb);
      bVar3 = pMVar71[(int)uVar52].u.mem.scale;
      uVar29 = (ulong)bVar3;
      if (bVar3 == 0) {
        iVar31 = -1;
LAB_0016f08a:
        pcStack_3d0 = (code *)0x16f09d;
        MIR_new_int_op(pMVar60,iVar31);
        pcStack_3d0 = (code *)0x16f0ef;
        pMVar30 = MIR_new_insn(pMVar60,MIR_LSH);
        pcStack_3d0 = (code *)0x16f100;
        gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar30);
        if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
          pcStack_3d0 = (code *)0x16f126;
          fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
          pcStack_3d0 = (code *)0x16f143;
          MIR_output_insn(pMVar60,pgVar58->debug_file,pMVar30,(pgVar58->curr_func_item->u).func,1);
        }
      }
      else if (bVar3 != 1) {
        lVar42 = 0;
        uVar59 = uVar29;
        if ((bVar3 & 1) == 0) {
          do {
            lVar42 = lVar42 + 1;
            uVar29 = uVar59 >> 1;
            uVar40 = uVar59 & 2;
            uVar59 = uVar29;
          } while (uVar40 == 0);
        }
        iVar31 = -1;
        if (uVar29 == 1) {
          iVar31 = lVar42;
        }
        goto LAB_0016f08a;
      }
      pcStack_3d0 = (code *)0x16f19c;
      pMVar30 = MIR_new_insn(pMVar60,MIR_ADD);
      pcStack_3d0 = (code *)0x16f1ad;
      gen_add_insn_before(pgVar58,(MIR_insn_t)pgVar55,pMVar30);
      if (((FILE *)pgVar58->debug_file != (FILE *)0x0) && (1 < pgVar58->debug_level)) {
        pcStack_3d0 = (code *)0x16f1d3;
        fwrite("      ",6,1,(FILE *)pgVar58->debug_file);
        pcStack_3d0 = (code *)0x16f1f0;
        MIR_output_insn(pMVar60,pgVar58->debug_file,pMVar30,(pgVar58->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_308) {
        *(undefined8 *)((long)&pMStack_2f8[(long)paStack_300].u + 0x10) = 0xffffffff0000000a;
      }
      if (-1 < (int)uStack_30c) {
        *(undefined8 *)((long)&pMStack_2f8[uVar53].u + 0x10) = 0xffffffff0000000a;
      }
      pcStack_3d0 = (code *)0x16f25c;
      get_reload_hreg(pgVar58,0xffffffff,6,0);
      goto LAB_0016f25c;
    }
  }
  pcStack_3d0 = (code *)0x16fdd2;
  rewrite_insn_cold_19();
LAB_0016fdd2:
  pcStack_3d0 = (code *)0x16fdd7;
  rewrite_insn_cold_17();
LAB_0016fdd7:
  pcStack_3d0 = (code *)0x16fdf9;
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static MIR_reg_t get_stack_loc (gen_ctx_t gen_ctx, MIR_reg_t start_loc, MIR_type_t type,
                                bitmap_t conflict_locs, int *slots_num_ref) {
  MIR_reg_t loc, curr_loc, best_loc = MIR_NON_VAR;
  int k, slots_num = 1;
  for (loc = start_loc; loc <= func_stack_slots_num + MAX_HARD_REG; loc++) {
    slots_num = target_locs_num (loc, type);
    if (target_nth_loc (loc, type, slots_num - 1) > func_stack_slots_num + MAX_HARD_REG) break;
    for (k = 0; k < slots_num; k++) {
      curr_loc = target_nth_loc (loc, type, k);
      if (bitmap_bit_p (conflict_locs, curr_loc)) break;
    }
    if (k < slots_num) continue;
    if ((loc - MAX_HARD_REG - 1) % slots_num != 0)
      continue; /* we align stack slots according to the type size */
    if (best_loc == MIR_NON_VAR) best_loc = loc;
  }
  if (best_loc == MIR_NON_VAR) best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
  *slots_num_ref = slots_num;
  return best_loc;
}